

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_TestShell::
~TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_TestShell
          (TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_TestShell *this)

{
  TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_TestShell *this_local;
  
  ~TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(FailableMemoryAllocator, FailThirdAllocationAtGivenLine)
{
    int *memory[10] = { NULLPTR };
    int allocation;
    failableMallocAllocator->failNthAllocAt(3, __FILE__, __LINE__ + 4);

    for (allocation = 1; allocation <= 10; allocation++)
    {
        memory[allocation - 1] = (int *)malloc(sizeof(int));
        if (memory[allocation - 1] == NULLPTR)
            break;
        free(memory[allocation -1]);
    }

    LONGS_EQUAL(3, allocation);
}